

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall VmaAllocator_T::DestroyPool(VmaAllocator_T *this,VmaPool pool)

{
  VmaMutexLockWrite lock;
  VmaMutexLockWrite local_18;
  
  local_18.m_pMutex = (VmaRWMutex *)0x0;
  if (this->m_UseMutex != false) {
    local_18.m_pMutex = &this->m_PoolsMutex;
  }
  if (this->m_UseMutex == true) {
    std::__shared_mutex_pthread::lock((__shared_mutex_pthread *)&this->m_PoolsMutex);
  }
  VmaIntrusiveLinkedList<VmaPoolListItemTraits>::Remove(&this->m_Pools,pool);
  VmaMutexLockWrite::~VmaMutexLockWrite(&local_18);
  vma_delete<VmaPool_T>(this,pool);
  return;
}

Assistant:

void VmaAllocator_T::DestroyPool(VmaPool pool)
{
    // Remove from m_Pools.
    {
        VmaMutexLockWrite lock(m_PoolsMutex, m_UseMutex);
        m_Pools.Remove(pool);
    }

    vma_delete(this, pool);
}